

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O3

void __thiscall
rr::FragmentProcessor::executeStencilDpFailAndPass
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,StencilState *stencilState,int numStencilBits,
          PixelBufferAccess *stencilBuffer)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  bool *pbVar11;
  
  uVar7 = ~(-1 << ((byte)numStencilBits & 0x1f));
  uVar5 = stencilState->ref;
  uVar9 = uVar7;
  if ((int)uVar5 < (int)uVar7) {
    uVar9 = uVar5;
  }
  uVar6 = 0;
  if (-1 < (int)uVar5) {
    uVar6 = uVar9;
  }
  switch(stencilState->dpFail) {
  case STENCILOP_KEEP:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == false)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar8 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar8,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,iVar8,inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_ZERO:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == false)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,~stencilState->writeMask & uVar5,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_REPLACE:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == false)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar6 ^ uVar5) & stencilState->writeMask ^ uVar5,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_INCR:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == false)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        uVar5 = uVar3 + 1;
        uVar9 = uVar7;
        if ((int)uVar5 < (int)uVar7) {
          uVar9 = uVar5;
        }
        if ((int)uVar5 < 0) {
          uVar9 = 0;
        }
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar9 ^ uVar3) & stencilState->writeMask ^ uVar3,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_DECR:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == false)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        uVar5 = uVar3 - 1;
        uVar9 = uVar7;
        if ((int)uVar5 < (int)uVar7) {
          uVar9 = uVar5;
        }
        if ((int)uVar5 < 0) {
          uVar9 = 0;
        }
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar9 ^ uVar3) & stencilState->writeMask ^ uVar3,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_INCR_WRAP:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == false)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar5 + 1 & uVar7 ^ uVar5) & stencilState->writeMask ^ uVar5,iVar2
                   ,inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_DECR_WRAP:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == false)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar5 - 1 & uVar7 ^ uVar5) & stencilState->writeMask ^ uVar5,iVar2
                   ,inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_INVERT:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == false)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar7 | uVar5) & stencilState->writeMask ^ uVar5,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
  }
  switch(stencilState->dpPass) {
  case STENCILOP_KEEP:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == true)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar8 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        iVar2 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar8,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,iVar2,iVar8,inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_ZERO:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == true)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,~stencilState->writeMask & uVar5,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_REPLACE:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == true)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar6 ^ uVar5) & stencilState->writeMask ^ uVar5,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_INCR:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == true)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar6 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        uVar5 = uVar6 + 1;
        uVar9 = uVar7;
        if ((int)uVar5 < (int)uVar7) {
          uVar9 = uVar5;
        }
        if ((int)uVar5 < 0) {
          uVar9 = 0;
        }
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar9 ^ uVar6) & stencilState->writeMask ^ uVar6,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_DECR:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == true)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar6 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        uVar5 = uVar6 - 1;
        uVar9 = uVar7;
        if ((int)uVar5 < (int)uVar7) {
          uVar9 = uVar5;
        }
        if ((int)uVar5 < 0) {
          uVar9 = 0;
        }
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar9 ^ uVar6) & stencilState->writeMask ^ uVar6,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_INCR_WRAP:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == true)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar5 + 1 & uVar7 ^ uVar5) & stencilState->writeMask ^ uVar5,iVar2
                   ,inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_DECR_WRAP:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == true)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar5 - 1 & uVar7 ^ uVar5) & stencilState->writeMask ^ uVar5,iVar2
                   ,inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
    break;
  case STENCILOP_INVERT:
    pbVar11 = &this->m_sampleRegister[0].depthPassed;
    uVar10 = 0;
    do {
      if ((((SampleData *)(pbVar11 + -2))->isAlive == true) && (*pbVar11 == true)) {
        uVar1 = (ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff;
        iVar4 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        iVar2 = (int)((long)uVar1 % (long)numSamplesPerFragment);
        uVar5 = tcu::ConstPixelBufferAccess::getPixStencil
                          (&stencilBuffer->super_ConstPixelBufferAccess,iVar2,
                           inputFragments[iVar4].pixelCoord.m_data[0],
                           inputFragments[iVar4].pixelCoord.m_data[1]);
        tcu::PixelBufferAccess::setPixStencil
                  (stencilBuffer,(uVar7 | uVar5) & stencilState->writeMask ^ uVar5,iVar2,
                   inputFragments[iVar4].pixelCoord.m_data[0],
                   inputFragments[iVar4].pixelCoord.m_data[1]);
      }
      uVar10 = uVar10 + 1;
      pbVar11 = pbVar11 + 0x84;
    } while (uVar10 != 0x40);
  }
  return;
}

Assistant:

void FragmentProcessor::executeStencilDpFailAndPass (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const StencilState& stencilState, int numStencilBits, const tcu::PixelBufferAccess& stencilBuffer)
{
#define SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, EXPRESSION)																													\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																								\
	{																																											\
		if (m_sampleRegister[regSampleNdx].isAlive && (CONDITION))																												\
		{																																										\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;																						\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];														\
			int					stencilBufferValue	= stencilBuffer.getPixStencil(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());										\
																																												\
			stencilBuffer.setPixStencil(maskedBitReplace(stencilBufferValue, (EXPRESSION), stencilState.writeMask), fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());	\
		}																																										\
	}

#define SWITCH_DPFAIL_OR_DPPASS(OP_NAME, CONDITION)																											\
		switch (stencilState.OP_NAME)																														\
		{																																					\
			case STENCILOP_KEEP:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, stencilBufferValue)												break;	\
			case STENCILOP_ZERO:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, 0)																break;	\
			case STENCILOP_REPLACE:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, clampedStencilRef)												break;	\
			case STENCILOP_INCR:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, de::clamp(stencilBufferValue+1, 0, (1<<numStencilBits) - 1))	break;	\
			case STENCILOP_DECR:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, de::clamp(stencilBufferValue-1, 0, (1<<numStencilBits) - 1))	break;	\
			case STENCILOP_INCR_WRAP:	SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, (stencilBufferValue + 1) & ((1<<numStencilBits) - 1))			break;	\
			case STENCILOP_DECR_WRAP:	SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, (stencilBufferValue - 1) & ((1<<numStencilBits) - 1))			break;	\
			case STENCILOP_INVERT:		SAMPLE_REGISTER_DPFAIL_OR_DPPASS(CONDITION, (~stencilBufferValue) & ((1<<numStencilBits) - 1))				break;	\
			default:																																		\
				DE_ASSERT(false);																															\
		}

	int clampedStencilRef = de::clamp(stencilState.ref, 0, (1<<numStencilBits)-1);

	SWITCH_DPFAIL_OR_DPPASS(dpFail, !m_sampleRegister[regSampleNdx].depthPassed)
	SWITCH_DPFAIL_OR_DPPASS(dpPass, m_sampleRegister[regSampleNdx].depthPassed)

#undef SWITCH_DPFAIL_OR_DPPASS
#undef SAMPLE_REGISTER_DPFAIL_OR_DPPASS
}